

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

void __thiscall
soplex::DSVectorBase<double>::DSVectorBase(DSVectorBase<double> *this,DSVectorBase<double> *old)

{
  DSVectorBase<double> *in_RSI;
  undefined8 *in_RDI;
  
  SVectorBase<double>::SVectorBase
            ((SVectorBase<double> *)in_RSI,(int)((ulong)in_RDI >> 0x20),(Nonzero<double> *)0x2a0276)
  ;
  *in_RDI = &PTR__DSVectorBase_004eb620;
  in_RDI[3] = 0;
  SVectorBase<double>::size(&in_RSI->super_SVectorBase<double>);
  allocMem(in_RSI,(int)((ulong)in_RDI >> 0x20));
  SVectorBase<double>::operator=((SVectorBase<double> *)this,(SVectorBase<double> *)old);
  return;
}

Assistant:

DSVectorBase(const DSVectorBase<R>& old)
      : SVectorBase<R>()
      , theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }